

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O3

void __thiscall boost::filesystem::path::path<char_const*>(path *this,char *begin,char *end)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> seq;
  long *local_40 [2];
  long local_30 [2];
  
  (this->m_pathname)._M_dataplus._M_p = (pointer)&(this->m_pathname).field_2;
  (this->m_pathname)._M_string_length = 0;
  (this->m_pathname).field_2._M_local_buf[0] = '\0';
  if (begin != end) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40);
    if (local_40[0] == (long *)0x0) {
      __assert_fail("from",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/filesystem/path_traits.hpp"
                    ,0xc2,
                    "void boost::filesystem::path_traits::convert(const char *, const char *, std::string &)"
                   );
    }
    std::__cxx11::string::replace
              ((ulong)this,(this->m_pathname)._M_string_length,(char *)0x0,(ulong)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

typename boost::enable_if<path_traits::is_pathable<
        typename boost::decay<Source>::type>, path&>::type
    operator=(Source const& source)
    {
      m_pathname.clear();
      path_traits::dispatch(source, m_pathname);
      return *this;
    }